

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O0

REF_STATUS ref_list_contains(REF_LIST ref_list,REF_INT item,REF_BOOL *contains)

{
  int local_2c;
  REF_INT i;
  REF_BOOL *contains_local;
  REF_INT item_local;
  REF_LIST ref_list_local;
  
  *contains = 0;
  local_2c = 0;
  while( true ) {
    if (ref_list->n <= local_2c) {
      return 0;
    }
    if (ref_list->value[local_2c] == item) break;
    local_2c = local_2c + 1;
  }
  *contains = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_list_contains(REF_LIST ref_list, REF_INT item,
                                     REF_BOOL *contains) {
  REF_INT i;

  *contains = REF_FALSE;

  for (i = 0; i < ref_list_n(ref_list); i++)
    if (ref_list->value[i] == item) {
      *contains = REF_TRUE;
      return REF_SUCCESS;
    }

  return REF_SUCCESS;
}